

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_scc(m68k_info *info)

{
  cs_m68k *pcVar1;
  cs_m68k_op *in_RDI;
  m68k_info *unaff_retaddr;
  cs_m68k *ext;
  undefined8 in_stack_fffffffffffffff0;
  
  pcVar1 = build_init_op(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                         (int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  get_ea_mode_op(unaff_retaddr,in_RDI,(uint)((ulong)pcVar1 >> 0x20),(uint)pcVar1);
  return;
}

Assistant:

static void d68000_scc(m68k_info *info)
{
	cs_m68k* ext = build_init_op(info, s_scc_lut[(info->ir >> 8) & 0xf], 1, 1);
	get_ea_mode_op(info, &ext->operands[0], info->ir, 1);
}